

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  int64_t iVar1;
  int64_t iVar2;
  reference pvVar3;
  undefined8 in_RDX;
  long *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  value_type vVar4;
  int64_t i;
  int64_t in_stack_ffffffffffffffc0;
  size_type sVar5;
  Matrix *in_stack_ffffffffffffffc8;
  size_type local_20;
  
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar2 = size((Vector *)0x1af29a);
  if (iVar1 != iVar2) {
    __assert_fail("A.size(0) == size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/vector.cc"
                  ,0x46,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar2 = size((Vector *)0x1af2e6);
  if (iVar1 == iVar2) {
    local_20 = 0;
    while( true ) {
      sVar5 = local_20;
      iVar1 = size((Vector *)0x1af331);
      if (iVar1 <= (long)sVar5) break;
      vVar4 = (value_type)(**(code **)(*in_RSI + 0x10))(in_RSI,in_RDX,local_20);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_20);
      *pvVar3 = vVar4;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("A.size(1) == vec.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/vector.cc"
                ,0x47,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}